

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O3

string * __thiscall
re2c::InputAPI::expr_lessthan_one_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  pointer pcVar1;
  long lVar2;
  opt_t *poVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  if (this->type_ == DEFAULT) {
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    pcVar1 = (poVar3->yylimit)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + (poVar3->yylimit)._M_string_length);
    std::__cxx11::string::append((char *)local_40);
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(poVar3->yycursor)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  else {
    expr_lessthan_abi_cxx11_(__return_storage_ptr__,this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_lessthan_one () const
{
	return type_ == DEFAULT
		? opts->yylimit + " <= " + opts->yycursor
		: expr_lessthan (1);
}